

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O2

int __thiscall HttpResponse::buildFirstLine(HttpResponse *this)

{
  string *psVar1;
  int iVar2;
  HttpResponse *this_00;
  char statusCodeBuf [17];
  
  statusCodeBuf[0x10] = '\0';
  iVar2 = snprintf(statusCodeBuf,0x10,"%d",(ulong)(uint)this->mResponseCode);
  if (0xf < iVar2) {
    jh_log_print(1,"virtual int HttpResponse::buildFirstLine() const",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpResponse.cpp"
                 ,0x103,"mResponseCode %d exceeds kStatusCodeSize %d",
                 (ulong)(uint)this->mResponseCode,0x10);
  }
  psVar1 = &(this->super_HttpHeader).super_HttpHeaderBase.mHeaderStr;
  std::__cxx11::string::assign((char *)psVar1);
  std::__cxx11::string::append((char *)psVar1);
  this_00 = (HttpResponse *)psVar1;
  std::__cxx11::string::append((char *)psVar1);
  getResponseString(this_00,this->mResponseCode);
  std::__cxx11::string::append((char *)psVar1);
  std::__cxx11::string::append((char *)psVar1);
  return (int)(this->super_HttpHeader).super_HttpHeaderBase.mHeaderStr._M_string_length;
}

Assistant:

int HttpResponse::buildFirstLine() const
{
	char statusCodeBuf[kStatusCodeSize + 1];
	statusCodeBuf[kStatusCodeSize] = '\0'; // terminate in case of error

	int res = snprintf(statusCodeBuf, kStatusCodeSize, "%d", mResponseCode);
	
	if (res >= kStatusCodeSize)
	{
		LOG_ERR_FATAL("mResponseCode %d exceeds kStatusCodeSize %d",
					  mResponseCode, kStatusCodeSize);
	}

	mHeaderStr = "HTTP/1.1 ";
	mHeaderStr += statusCodeBuf;
	mHeaderStr += " ";
	mHeaderStr += getResponseString(mResponseCode);
	mHeaderStr += "\r\n";
	
	return mHeaderStr.size();
}